

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  byte *pbVar1;
  uchar uVar2;
  connectdata *pcVar3;
  FILEPROTO *pFVar4;
  curl_trc_feat *pcVar5;
  CURLcode CVar6;
  int iVar7;
  char **ppcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  byte bVar12;
  byte bVar13;
  size_t sVar14;
  char *pcVar15;
  size_t sStack_50;
  char *rawPath;
  size_t pathLen;
  
  pcVar3 = data->conn;
  pFVar4 = (data->req).p.file;
  rawPath = (char *)0x0;
  pathLen = 0;
  pbVar1 = (byte *)((long)&pcVar3->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xeb;
  CVar6 = Curl_urldecode(pFVar4->path,0,&rawPath,&pathLen,REJECT_CTRL);
  pcVar9 = rawPath;
  if (CVar6 != CURLE_OK) {
    Curl_failf(data,"path contains control characters");
    return CVar6;
  }
  uVar2 = (data->set).ftp_filemethod;
  if (uVar2 == '\x03') {
    pcVar15 = strrchr(rawPath,0x2f);
    if (pcVar15 == (char *)0x0) goto LAB_0012b2f6;
    ppcVar8 = (char **)(*Curl_ccalloc)(1,8);
    (pcVar3->proto).ftpc.dirs = ppcVar8;
    if (ppcVar8 == (char **)0x0) {
LAB_0012b37c:
      (*Curl_cfree)(rawPath);
      return CURLE_OUT_OF_MEMORY;
    }
    sVar14 = (long)pcVar15 - (long)pcVar9;
    if ((long)pcVar15 - (long)pcVar9 == 0) {
      sVar14 = 1;
    }
    pcVar9 = (char *)Curl_memdup0(rawPath,sVar14);
    *(pcVar3->proto).ftpc.dirs = pcVar9;
    if (*(pcVar3->proto).ftpc.dirs == (char *)0x0) goto LAB_0012b37c;
    (pcVar3->proto).ftpc.dirdepth = 1;
    pcVar9 = pcVar15 + 1;
  }
  else {
    if (uVar2 != '\x02') {
      sVar14 = 0;
      pcVar15 = rawPath;
      do {
        if (*pcVar15 == '/') {
          sVar14 = sVar14 + 1;
        }
        else if (*pcVar15 == '\0') goto LAB_0012b276;
        pcVar15 = pcVar15 + 1;
      } while( true );
    }
    if ((pathLen == 0) || (rawPath[pathLen - 1] == '/')) goto LAB_0012b30f;
  }
LAB_0012b2fb:
  if (*pcVar9 == '\0') goto LAB_0012b30f;
  pcVar9 = (*Curl_cstrdup)(pcVar9);
LAB_0012b311:
  sVar14 = pathLen;
  (pcVar3->proto).ftpc.file = pcVar9;
  if (((((data->state).field_0x776 & 2) != 0) && (pcVar9 == (char *)0x0)) && (pFVar4->fd == 0)) {
    Curl_failf(data,"Uploading to a URL without a filename");
    (*Curl_cfree)(rawPath);
    return CURLE_URL_MALFORMAT;
  }
  bVar12 = *(byte *)((long)&pcVar3->proto + 0x112);
  bVar13 = bVar12 & 0xf7;
  *(byte *)((long)&pcVar3->proto + 0x112) = bVar13;
  uVar2 = (data->set).ftp_filemethod;
  if ((uVar2 != '\x02') || (*rawPath != '/')) {
    if (((ulong)pcVar3->bits & 0x40) == 0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pcVar3->proto).ftpc.prevpath;
      if (pcVar15 == (char *)0x0) goto LAB_0012b403;
    }
    if (uVar2 == '\x02') {
      sVar10 = 0;
    }
    else {
      if (pcVar9 == (char *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = strlen(pcVar9);
      }
      sVar10 = sVar14 - sVar10;
    }
    sVar11 = strlen(pcVar15);
    if ((sVar11 != sVar10) || (iVar7 = strncmp(rawPath,pcVar15,sVar10), iVar7 != 0))
    goto LAB_0012b403;
    bVar12 = bVar13;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"Request has same path as previous transfer");
      bVar12 = *(byte *)((long)&pcVar3->proto + 0x112);
    }
  }
  *(byte *)((long)&pcVar3->proto + 0x112) = bVar12 | 8;
LAB_0012b403:
  (*Curl_cfree)(rawPath);
  return CURLE_OK;
LAB_0012b276:
  if (sVar14 != 0) {
    ppcVar8 = (char **)(*Curl_ccalloc)(sVar14,8);
    (pcVar3->proto).ftpc.dirs = ppcVar8;
    if (ppcVar8 == (char **)0x0) goto LAB_0012b37c;
    while (pcVar15 = strchr(pcVar9,0x2f), pcVar15 != (char *)0x0) {
      sStack_50 = (long)pcVar15 - (long)pcVar9;
      if ((sStack_50 != 0) || (sStack_50 = 1, (pcVar3->proto).ftpc.dirdepth == 0)) {
        pcVar9 = (char *)Curl_memdup0(pcVar9,sStack_50);
        if (pcVar9 == (char *)0x0) goto LAB_0012b37c;
        iVar7 = (pcVar3->proto).ftpc.dirdepth;
        (pcVar3->proto).ftpc.dirdepth = iVar7 + 1;
        (pcVar3->proto).ftpc.dirs[iVar7] = pcVar9;
      }
      pcVar9 = pcVar15 + 1;
    }
  }
LAB_0012b2f6:
  if (pcVar9 != (char *)0x0) goto LAB_0012b2fb;
LAB_0012b30f:
  pcVar9 = (char *)0x0;
  goto LAB_0012b311;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
        fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
          dirlen = 1;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = Curl_memdup0(rawPath, dirlen);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is filename */
      }
      else
        fileName = rawPath; /* filename only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      /* number of entries allocated for the 'dirs' array */
      size_t dirAlloc = 0;
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if(*str == '/')
          ++dirAlloc;

      if(dirAlloc) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) does not
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = Curl_memdup0(curPos, compLen);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT((size_t)ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the filename (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->state.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a filename when uploading. Return error! */
    failf(data, "Uploading to a URL without a filename");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file ? strlen(ftpc->file) : 0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}